

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

N_Vector N_VNew_Serial(sunindextype length,SUNContext sunctx)

{
  void *pvVar1;
  undefined8 in_RSI;
  int in_EDI;
  realtype *data;
  N_Vector v;
  N_Vector local_8;
  
  local_8 = N_VNewEmpty_Serial((sunindextype)((ulong)in_RSI >> 0x20),(SUNContext)0x0);
  if (local_8 == (N_Vector)0x0) {
    local_8 = (N_Vector)0x0;
  }
  else if (0 < in_EDI) {
    pvVar1 = malloc((long)in_EDI << 3);
    if (pvVar1 == (void *)0x0) {
      N_VDestroy_Serial((N_Vector)0xeced9e);
      local_8 = (N_Vector)0x0;
    }
    else {
      *(undefined4 *)((long)local_8->content + 4) = 1;
      *(void **)((long)local_8->content + 8) = pvVar1;
    }
  }
  return local_8;
}

Assistant:

N_Vector N_VNew_Serial(sunindextype length, SUNContext sunctx)
{
  N_Vector v;
  realtype *data;

  v = NULL;
  v = N_VNewEmpty_Serial(length, sunctx);
  if (v == NULL) return(NULL);

  /* Create data */
  if (length > 0) {

    /* Allocate memory */
    data = NULL;
    data = (realtype *) malloc(length * sizeof(realtype));
    if(data == NULL) { N_VDestroy_Serial(v); return(NULL); }

    /* Attach data */
    NV_OWN_DATA_S(v) = SUNTRUE;
    NV_DATA_S(v)     = data;

  }

  return(v);
}